

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::SubDFriendlyTag(ON_NurbsCurve *this)

{
  byte *pbVar1;
  bool bVar2;
  
  if (-1 < (int)this->m_knot_capacity_and_tags) {
    return false;
  }
  bVar2 = IsSubDFriendly(this,true);
  if (!bVar2) {
    pbVar1 = (byte *)((long)&this->m_knot_capacity_and_tags + 3);
    *pbVar1 = *pbVar1 & 0x7f;
  }
  return bVar2;
}

Assistant:

bool ON_NurbsCurve::SubDFriendlyTag() const
{
  if (0 != (m_knot_capacity_and_tags & ON_NurbsCurve::masks::subdfriendly_tag))
  {
    if (IsSubDFriendly(true))
      return true;
    // Something modified NURBS properties after the tag was set.
    const_cast<ON_NurbsCurve*>(this)->SetSubDFriendlyTag(false);
  }
  return false;
}